

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O3

string * cmStrCat<char_const(&)[7],std::__cxx11::string_const&,std::__cxx11::string_const&,char,std::__cxx11::string_const&,char_const(&)[16]>
                   (string *__return_storage_ptr__,char (*a) [7],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char *args_1,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char (*args_3) [16])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  char local_e0 [32];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_c0;
  size_type local_a8;
  pointer local_a0;
  undefined8 local_98;
  size_type local_90;
  pointer local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  size_type local_60;
  pointer local_58;
  undefined8 local_50;
  size_t local_48;
  char (*local_40) [16];
  undefined8 local_38;
  
  local_c0.first._M_len = strlen(*a);
  local_c0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_a0 = (b->_M_dataplus)._M_p;
  local_a8 = b->_M_string_length;
  local_98 = 0;
  local_88 = (args->_M_dataplus)._M_p;
  local_90 = args->_M_string_length;
  local_80 = 0;
  local_e0[0] = *args_1;
  local_70 = local_e0;
  local_78 = 1;
  local_68 = 0;
  local_58 = (args_2->_M_dataplus)._M_p;
  local_60 = args_2->_M_string_length;
  local_50 = 0;
  local_c0.first._M_str = *a;
  local_48 = strlen(*args_3);
  local_40 = args_3;
  local_38 = 0;
  views._M_len = 6;
  views._M_array = &local_c0;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}